

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O3

void idx2::Dealloc(brick_pool *Bp)

{
  allocator *paVar1;
  long lVar2;
  long lVar3;
  brick_volume *Vol;
  long lVar4;
  
  paVar1 = (Bp->ResolutionLevels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&Bp->ResolutionLevels);
  (Bp->ResolutionLevels).Size = 0;
  (Bp->ResolutionLevels).Capacity = 0;
  lVar4 = (Bp->BrickTable).LogCapacity;
  lVar2 = 1L << ((byte)lVar4 & 0x3f);
  if (lVar4 == 0x3f) {
    lVar4 = -0x8000000000000000;
LAB_00185a04:
    if (lVar4 != lVar2) {
      Vol = (Bp->BrickTable).Vals + lVar4;
      do {
        Dealloc(&Vol->Vol);
        lVar2 = lVar4 * -0x40;
        do {
          lVar2 = lVar2 + -0x40;
          lVar3 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while ((Bp->BrickTable).Stats[lVar3] != Occupied);
        Vol = (brick_volume *)((long)(Bp->BrickTable).Vals - lVar2);
      } while (1L << ((byte)(Bp->BrickTable).LogCapacity & 0x3f) != lVar4);
    }
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    do {
      if ((Bp->BrickTable).Stats[lVar4] == Occupied) goto LAB_00185a04;
      lVar4 = lVar4 + 1;
    } while (lVar3 + 1 != lVar4);
  }
  Dealloc<unsigned_long,idx2::brick_volume>(&Bp->BrickTable);
  return;
}

Assistant:

void
Dealloc(brick_pool* Bp)
{
  Dealloc(&Bp->ResolutionLevels);
  idx2_ForEach (It, Bp->BrickTable)
    Dealloc(&It.Val->Vol);
  Dealloc(&Bp->BrickTable);
}